

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

void __thiscall llvm::hashing::detail::hash_state::mix(hash_state *this,char *s)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  char *s_local;
  hash_state *this_local;
  
  uVar2 = this->h0;
  uVar4 = this->h1;
  uVar3 = this->h3;
  uVar1 = fetch64(s + 8);
  uVar2 = rotate(uVar2 + uVar4 + uVar3 + uVar1,0x25);
  this->h0 = uVar2 * -0x4b6d499041670d8d;
  uVar2 = this->h1;
  uVar4 = this->h4;
  uVar3 = fetch64(s + 0x30);
  uVar2 = rotate(uVar2 + uVar4 + uVar3,0x2a);
  this->h1 = uVar2 * -0x4b6d499041670d8d;
  this->h0 = this->h6 ^ this->h0;
  uVar2 = this->h3;
  uVar4 = fetch64(s + 0x28);
  this->h1 = uVar2 + uVar4 + this->h1;
  uVar2 = rotate(this->h2 + this->h5,0x21);
  this->h2 = uVar2 * -0x4b6d499041670d8d;
  this->h3 = this->h4 * -0x4b6d499041670d8d;
  this->h4 = this->h0 + this->h5;
  mix_32_bytes(s,&this->h3,&this->h4);
  this->h5 = this->h2 + this->h6;
  uVar2 = this->h1;
  uVar4 = fetch64(s + 0x10);
  this->h6 = uVar2 + uVar4;
  mix_32_bytes(s + 0x20,&this->h5,&this->h6);
  std::swap<unsigned_long>(&this->h2,&this->h0);
  return;
}

Assistant:

void mix(const char *s) {
    h0 = rotate(h0 + h1 + h3 + fetch64(s + 8), 37) * k1;
    h1 = rotate(h1 + h4 + fetch64(s + 48), 42) * k1;
    h0 ^= h6;
    h1 += h3 + fetch64(s + 40);
    h2 = rotate(h2 + h5, 33) * k1;
    h3 = h4 * k1;
    h4 = h0 + h5;
    mix_32_bytes(s, h3, h4);
    h5 = h2 + h6;
    h6 = h1 + fetch64(s + 16);
    mix_32_bytes(s + 32, h5, h6);
    std::swap(h2, h0);
  }